

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

char * __thiscall QMetaEnum::valueToKey(QMetaEnum *this,quint64 value)

{
  QMetaObject *mo;
  bool bVar1;
  EnumExtendMode mode_00;
  qint32 qVar2;
  quint32 qVar3;
  quint64 qVar4;
  char *pcVar5;
  quint64 in_RSI;
  QMetaEnum *in_RDI;
  int i;
  EnumExtendMode mode;
  QMetaEnum *in_stack_ffffffffffffffc0;
  uint *puVar6;
  int local_20;
  quint64 qVar7;
  QMetaEnum *this_00;
  
  if (in_RDI->mobj != (QMetaObject *)0x0) {
    this_00 = in_RDI;
    mode_00 = enumExtendMode(in_stack_ffffffffffffffc0);
    bVar1 = isEnumValueSuitable(in_RSI,mode_00);
    if (bVar1) {
      for (local_20 = 0; qVar2 = Data::keyCount(&in_RDI->data), local_20 < qVar2;
          local_20 = local_20 + 1) {
        qVar7 = in_RSI;
        qVar4 = value_helper<EnumExtendMode>(this_00,(uint)(in_RSI >> 0x20),(EnumExtendMode)in_RSI);
        if (in_RSI == qVar4) {
          mo = in_RDI->mobj;
          puVar6 = (in_RDI->mobj->d).data;
          qVar3 = Data::data(&in_RDI->data);
          pcVar5 = rawStringData(mo,puVar6[qVar3 + local_20 * 2]);
          return pcVar5;
        }
        in_RSI = qVar7;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *QMetaEnum::valueToKey(quint64 value) const
{
    if (!mobj)
        return nullptr;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return nullptr;

    for (int i = 0; i < int(data.keyCount()); ++i) {
        if (value == value_helper(i, mode))
            return rawStringData(mobj, mobj->d.data[data.data() + 2 * i]);
    }
    return nullptr;
}